

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  int iVar1;
  CppType CVar2;
  undefined4 extraout_var;
  FieldDescriptor *this_00;
  Message *pMVar3;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Reflection *this_01;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var,iVar1));
  CVar2 = FieldDescriptor::cpp_type(this_00);
  (map_val->super_MapValueConstRef).type_ = CVar2;
  CVar2 = FieldDescriptor::cpp_type(this_00);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<int>((this->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_INT64:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<long>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_UINT32:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<unsigned_int>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_UINT64:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<unsigned_long>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_DOUBLE:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<double>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_FLOAT:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<float>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_BOOL:
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<bool>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_STRING:
    pbVar4 = Arena::Create<std::__cxx11::string>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case CPPTYPE_MESSAGE:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
    pMVar3 = Reflection::GetMessage(this_01,this->default_entry_,this_00,(MessageFactory *)0x0);
    iVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])
                      (pMVar3,(this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_003a15cf_default;
  }
  (map_val->super_MapValueConstRef).data_ = pbVar4;
switchD_003a15cf_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    map_val->SetValue(value);                                \
    break;                                                   \
  }
    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32_t);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New(MapFieldBase::arena_);
      map_val->SetValue(value);
      break;
    }
  }
}